

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall pugi::xml_node::append_child(xml_node *this,xml_node_type type_)

{
  ulong uVar1;
  xml_allocator *this_00;
  xml_node xVar2;
  xml_node_struct *pxVar3;
  uint uVar4;
  xml_node n;
  xml_node local_28;
  xml_node local_20;
  
  pxVar3 = this->_root;
  if (pxVar3 == (xml_node_struct *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (uint)pxVar3->header & 0xf;
  }
  if (((node_document < type_) && (0xfffffffd < uVar4 - 3)) &&
     ((type_ + ~node_doctype < 0xfffffffe || (uVar4 == 1)))) {
    if (pxVar3 == (xml_node_struct *)0x0) {
      __assert_fail("object",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x486,
                    "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_node_struct]"
                   );
    }
    this_00 = *(xml_allocator **)((long)pxVar3 - (pxVar3->header >> 8));
    uVar1 = this_00->_busy_size + 0x40;
    if (uVar1 < 0x7fd9) {
      local_28._root = (xml_node_struct *)this_00->_root;
      pxVar3 = (xml_node_struct *)((long)&(local_28._root)->prev_sibling_c + this_00->_busy_size);
      this_00->_busy_size = uVar1;
    }
    else {
      pxVar3 = (xml_node_struct *)
               impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                         (this_00,0x40,(xml_memory_page **)&local_28);
    }
    if (pxVar3 == (xml_node_struct *)0x0) {
      pxVar3 = (xml_node_struct *)0x0;
    }
    else {
      pxVar3->prev_sibling_c = (xml_node_struct *)0x0;
      pxVar3->next_sibling = (xml_node_struct *)0x0;
      pxVar3->parent = (xml_node_struct *)0x0;
      pxVar3->first_child = (xml_node_struct *)0x0;
      pxVar3->name = (char_t *)0x0;
      pxVar3->value = (char_t *)0x0;
      pxVar3->first_attribute = (xml_attribute_struct *)0x0;
      pxVar3->header = (ulong)type_ | ((long)pxVar3 - (long)local_28._root) * 0x100;
    }
    xml_node(&local_28,pxVar3);
    if (local_28._root != (xml_node_struct *)0x0) {
      pxVar3 = this->_root;
      (local_28._root)->parent = pxVar3;
      xVar2._root = pxVar3->first_child;
      if (xVar2._root == (xml_node_struct *)0x0) {
        pxVar3->first_child = local_28._root;
        xVar2._root = local_28._root;
      }
      else {
        pxVar3 = (xVar2._root)->prev_sibling_c;
        pxVar3->next_sibling = local_28._root;
        (local_28._root)->prev_sibling_c = pxVar3;
      }
      (xVar2._root)->prev_sibling_c = local_28._root;
      if (type_ == node_declaration) {
        set_name(&local_28,"xml");
      }
      return (xml_node)local_28._root;
    }
  }
  xml_node(&local_20);
  return (xml_node)local_20._root;
}

Assistant:

PUGI__FN xml_node xml_node::append_child(xml_node_type type_)
	{
		if (!impl::allow_insert_child(type(), type_)) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::append_node(n._root, _root);

		if (type_ == node_declaration) n.set_name(PUGIXML_TEXT("xml"));

		return n;
	}